

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_cast.cpp
# Opt level: O1

bool duckdb::StatisticsPropagator::CanPropagateCast(LogicalType *source,LogicalType *target)

{
  PhysicalType PVar1;
  LogicalTypeId LVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  LogicalTypeId LVar6;
  
  bVar3 = LogicalType::operator==(source,target);
  bVar4 = 1;
  if (bVar3) goto LAB_00c94d4d;
  PVar1 = source->physical_type_;
  if (((PVar1 < 0xd) && ((0x1aa8U >> (PVar1 & 0x1f) & 1) != 0)) || (PVar1 == INT128)) {
    PVar1 = target->physical_type_;
    if (((PVar1 < 0xd) && ((0x1aa8U >> (PVar1 & 0x1f) & 1) != 0)) || (PVar1 == INT128)) {
      LVar6 = target->id_;
      switch(LVar6) {
      case TIME:
        LVar6 = source->id_;
        if (LVar6 < (TIMESTAMP_TZ|SQLNULL)) {
          uVar5 = 0xffe1ffff;
LAB_00c94d37:
          bVar4 = (byte)(uVar5 >> (LVar6 & (TIMESTAMP_TZ|UBIGINT)));
          goto LAB_00c94d4d;
        }
        break;
      case TIMESTAMP_SEC:
        LVar6 = source->id_;
        if (LVar6 < (TIMESTAMP_TZ|SQLNULL)) {
          uVar5 = 0xffe3ffff;
          goto LAB_00c94d37;
        }
        break;
      case TIMESTAMP_MS:
        LVar6 = source->id_;
        if (LVar6 < (TIMESTAMP_TZ|SQLNULL)) {
          uVar5 = 0xffe5ffff;
          goto LAB_00c94d37;
        }
        break;
      case TIMESTAMP:
switchD_00c94cc8_caseD_13:
        LVar2 = source->id_;
        bVar4 = 0;
        if (LVar2 < TIMESTAMP_NS) {
          if (LVar2 - 0x11 < 2) goto LAB_00c94d4d;
          if ((LVar2 == TIMESTAMP) && (LVar6 == TIMESTAMP_TZ)) goto LAB_00c94d0b;
        }
        else {
          if (LVar2 == TIMESTAMP_NS) goto LAB_00c94d4d;
          if ((LVar2 == TIMESTAMP_TZ) && (LVar6 == TIMESTAMP)) goto LAB_00c94d0b;
        }
        break;
      case TIMESTAMP_NS:
        LVar6 = source->id_;
        if (LVar6 < (TIMESTAMP_TZ|SQLNULL)) {
          uVar5 = 0xfff1ffff;
          goto LAB_00c94d37;
        }
        break;
      default:
        if (LVar6 == TIMESTAMP_TZ) goto switchD_00c94cc8_caseD_13;
      }
      bVar4 = 1;
      goto LAB_00c94d4d;
    }
  }
LAB_00c94d0b:
  bVar4 = 0;
LAB_00c94d4d:
  return (bool)(bVar4 & 1);
}

Assistant:

bool StatisticsPropagator::CanPropagateCast(const LogicalType &source, const LogicalType &target) {
	if (source == target) {
		return true;
	}
	// we can only propagate numeric -> numeric
	switch (source.InternalType()) {
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		break;
	default:
		return false;
	}
	switch (target.InternalType()) {
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		break;
	default:
		return false;
	}
	// for time/timestamps/dates - there are various limitations on what we can propagate
	//	Downcasting timestamps to times is not a truncation operation
	switch (target.id()) {
	case LogicalTypeId::TIME: {
		switch (source.id()) {
		case LogicalTypeId::TIMESTAMP:
		case LogicalTypeId::TIMESTAMP_SEC:
		case LogicalTypeId::TIMESTAMP_MS:
		case LogicalTypeId::TIMESTAMP_NS:
		case LogicalTypeId::TIMESTAMP_TZ:
			return false;
		default:
			break;
		}
		break;
	}
	// FIXME: perform actual stats propagation for these casts
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ: {
		const bool to_timestamp = target.id() == LogicalTypeId::TIMESTAMP;
		const bool to_timestamp_tz = target.id() == LogicalTypeId::TIMESTAMP_TZ;
		//  Casting to timestamp[_tz] (us) from a different unit can not re-use stats
		switch (source.id()) {
		case LogicalTypeId::TIMESTAMP_NS:
		case LogicalTypeId::TIMESTAMP_MS:
		case LogicalTypeId::TIMESTAMP_SEC:
			return false;
		case LogicalTypeId::TIMESTAMP: {
			if (to_timestamp_tz) {
				// Both use INT64 physical type, but should not be treated equal
				return false;
			}
			break;
		}
		case LogicalTypeId::TIMESTAMP_TZ: {
			if (to_timestamp) {
				// Both use INT64 physical type, but should not be treated equal
				return false;
			}
			break;
		}
		default:
			break;
		}
		break;
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		// Same as above ^
		switch (source.id()) {
		case LogicalTypeId::TIMESTAMP:
		case LogicalTypeId::TIMESTAMP_TZ:
		case LogicalTypeId::TIMESTAMP_MS:
		case LogicalTypeId::TIMESTAMP_SEC:
			return false;
		default:
			break;
		}
		break;
	}
	case LogicalTypeId::TIMESTAMP_MS: {
		// Same as above ^
		switch (source.id()) {
		case LogicalTypeId::TIMESTAMP:
		case LogicalTypeId::TIMESTAMP_TZ:
		case LogicalTypeId::TIMESTAMP_NS:
		case LogicalTypeId::TIMESTAMP_SEC:
			return false;
		default:
			break;
		}
		break;
	}
	case LogicalTypeId::TIMESTAMP_SEC: {
		// Same as above ^
		switch (source.id()) {
		case LogicalTypeId::TIMESTAMP:
		case LogicalTypeId::TIMESTAMP_TZ:
		case LogicalTypeId::TIMESTAMP_NS:
		case LogicalTypeId::TIMESTAMP_MS:
			return false;
		default:
			break;
		}
		break;
	}
	default:
		break;
	}
	// we can propagate!
	return true;
}